

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O2

Real __thiscall
amrex::LineDistFcnElement2d::cpdist(LineDistFcnElement2d *this,RealVect pt,RealVect *cpmin)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  LineDistFcnElement2d *this_00;
  long lVar5;
  double local_58;
  Real dist;
  RealVect cp;
  
  cp.vect[0] = 0.0;
  cp.vect[1] = 0.0;
  cp.vect[2] = 0.0;
  pdVar1 = (this->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pdVar2 = (this->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_58 = 1e+29;
  this_00 = this;
  for (lVar5 = 1; lVar5 < (int)((ulong)((long)pdVar1 - (long)pdVar2) >> 3); lVar5 = lVar5 + 1) {
    pdVar3 = (this->control_points_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->control_points_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    single_seg_cpdist(this_00,pt,pdVar3[lVar5 + -1],pdVar3[lVar5],pdVar4[lVar5 + -1],pdVar4[lVar5],
                      &cp,&dist);
    if (dist < local_58) {
      cpmin->vect[2] = cp.vect[2];
      cpmin->vect[0] = cp.vect[0];
      cpmin->vect[1] = cp.vect[1];
      local_58 = dist;
    }
  }
  return local_58;
}

Assistant:

amrex::Real LineDistFcnElement2d::cpdist(amrex::RealVect pt,
                                         amrex::RealVect & cpmin) const {

  amrex::Real mindist, dist;
  mindist = 1.0e29;
  amrex::RealVect cp;

  for (int i=1, N=control_points_x.size(); i<N; ++i) {
    single_seg_cpdist(pt,
                      control_points_x[i-1], control_points_x[i],
                      control_points_y[i-1], control_points_y[i],
                      cp, dist);
    if (dist < mindist) {
      mindist = dist;
      cpmin = cp;
    }
  }
  return mindist;

}